

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O0

argParserAdvancedConfiguration * __thiscall
argParserAdvancedConfiguration::getAdditionalHelpFor
          (argParserAdvancedConfiguration *this,string *command)

{
  bool bVar1;
  argument *paVar2;
  string *in_RDX;
  string local_180 [32];
  string local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [39];
  undefined1 local_99;
  string local_98 [8];
  string help;
  string local_78 [48];
  string local_48 [32];
  argument *local_28;
  argument *arg;
  string *command_local;
  argParserAdvancedConfiguration *this_local;
  string *out;
  
  command_local = command;
  this_local = this;
  std::__cxx11::string::string(local_48,in_RDX);
  paVar2 = getArgument((argParserAdvancedConfiguration *)command,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  local_28 = paVar2;
  if (paVar2 == (argument *)0x0) {
    std::operator+((char *)local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "no such command \"");
    std::operator+(&this->helpMessage,(char *)local_78);
    std::__cxx11::string::~string(local_78);
  }
  else {
    std::__cxx11::string::string(local_98,(string *)&paVar2->additionalHelp);
    local_99 = 0;
    std::operator+((char *)local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\n additional help for \"");
    std::operator+(local_140,(char *)local_160);
    std::operator+(local_120,local_140);
    std::operator+(local_100,(char *)local_120);
    std::operator+(local_e0,local_100);
    std::operator+(local_c0,(char *)local_e0);
    std::operator+(&this->helpMessage,local_c0);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string(local_160);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98,"");
    if (bVar1) {
      std::operator+((char *)local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1172dd);
      std::__cxx11::string::operator+=((string *)this,local_180);
      std::__cxx11::string::~string(local_180);
    }
    else {
      std::__cxx11::string::operator+=((string *)this,"\n\t no additional help available");
    }
    local_99 = 1;
    std::__cxx11::string::~string(local_98);
  }
  return this;
}

Assistant:

string argParserAdvancedConfiguration::getAdditionalHelpFor(string command){

    argument * arg = getArgument(command);
    if(arg == nullptr)
        return "no such command \"" + command +"\"";

    string help = arg->additionalHelp;
    string out = "\n additional help for \"" + command + "\" \n\t <" +  arg->argShort+ ">  <" +
            arg->argLong + ">  \t" + arg->helpMessage;
    if(help != "")
        out += "\n" + help;
    else
        out += "\n\t no additional help available";
    return out;
}